

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsDrawTest.cpp
# Opt level: O3

bool deqp::gls::pixelNeighborhoodContainsColor
               (Surface *target,int x,int y,RGBA *color,IVec3 *compareThreshold)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = y + -1;
  bVar1 = true;
  iVar3 = -1;
  do {
    iVar5 = -1;
    do {
      bVar2 = tcu::compareThresholdMasked
                        ((RGBA)color->m_value,
                         (RGBA)*(deUint32 *)
                                ((long)(target->m_pixels).m_ptr +
                                (long)(target->m_width * iVar4 + x + iVar5) * 4),
                         (RGBA)(compareThreshold->m_data[1] << 8 | compareThreshold->m_data[0] |
                               compareThreshold->m_data[2] << 0x10),7);
      if (bVar2) {
        return bVar1;
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 != 2);
    iVar5 = iVar3 + 1;
    bVar1 = iVar3 < 1;
    iVar4 = iVar4 + 1;
    iVar3 = iVar5;
  } while (iVar5 != 2);
  return bVar1;
}

Assistant:

static bool pixelNeighborhoodContainsColor (const tcu::Surface& target, int x, int y, const tcu::RGBA& color, const tcu::IVec3& compareThreshold)
{
	// should not be called for edge pixels
	DE_ASSERT(x >= 1 && x <= target.getWidth()-2);
	DE_ASSERT(y >= 1 && y <= target.getHeight()-2);

	for (int dy = -1; dy < 2; dy++)
	for (int dx = -1; dx < 2; dx++)
	{
		const tcu::RGBA	targetCmpPixel = target.getPixel(x+dx, y+dy);
		if (colorsEqual(color, targetCmpPixel, compareThreshold))
			return true;
	}

	return false;
}